

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

void vkt::api::anon_unknown_1::GraphicsPipeline::initPrograms(SourceCollections *dst)

{
  long *local_88;
  long local_80;
  long local_78 [2];
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"vert","");
  local_40._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
  local_38._M_p = (pointer)&local_28;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,local_88,local_80 + (long)local_88);
  ShaderModule::initPrograms(dst,(Parameters *)local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"frag","");
  local_68._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_88,local_80 + (long)local_88);
  ShaderModule::initPrograms(dst,(Parameters *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

static void initPrograms (SourceCollections& dst, Parameters)
	{
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_VERTEX_BIT, "vert"));
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_FRAGMENT_BIT, "frag"));
	}